

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

TaskExecutionResult __thiscall
duckdb::HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping
          (HashAggregateDistinctFinalizeTask *this,idx_t grouping_idx)

{
  _Atomic_word *p_Var1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  PhysicalHashAggregate *pPVar3;
  HashAggregateGlobalSinkState *pHVar4;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var5;
  ClientContext *context;
  GroupingSet *pGVar6;
  undefined8 uVar7;
  SourceResultType SVar8;
  int iVar9;
  type pDVar10;
  const_reference pvVar11;
  reference this_00;
  type pDVar12;
  type pDVar13;
  const_reference this_01;
  pointer pEVar14;
  BoundAggregateExpression *pBVar15;
  size_type sVar16;
  mapped_type *pmVar17;
  reference this_02;
  pointer pRVar18;
  type pLVar19;
  const_reference this_03;
  const_reference this_04;
  reference this_05;
  pointer this_06;
  reference this_07;
  type this_08;
  reference this_09;
  BoundReferenceExpression *pBVar20;
  reference pvVar21;
  reference pvVar22;
  type lstate_p;
  TaskExecutionResult TVar23;
  uint uVar24;
  size_type __n;
  ulong uVar25;
  long lVar26;
  initializer_list<unsigned_long> __l;
  ExecutionContext execution_context;
  DataChunk group_chunk;
  OperatorSourceInput source_input;
  OperatorSinkInput sink_input;
  InterruptState interrupt_state;
  DataChunk output_chunk;
  DataChunk aggregate_input_chunk;
  ThreadContext thread_context;
  allocator_type local_2c9;
  type local_2c8;
  idx_t *local_2c0;
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *local_2b8;
  const_reference local_2b0;
  type local_2a8;
  Event *local_2a0;
  pointer local_298;
  pointer local_290;
  size_type *local_288;
  reference local_280;
  ExecutionContext local_278;
  weak_ptr<duckdb::Task,_true> local_260;
  RadixPartitionedHashTable local_250;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_1e8;
  long local_1e0;
  type local_1d8;
  size_type local_1d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1c8;
  OperatorSourceInput local_1b0;
  OperatorSinkInput local_198;
  InterruptState local_180;
  undefined1 local_158 [88];
  element_type *local_100;
  ThreadContext local_d8;
  
  pDVar10 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
            ::operator*(&this->op->distinct_collection_info);
  pvVar11 = vector<duckdb::HashAggregateGroupingData,_true>::operator[]
                      (&this->op->groupings,grouping_idx);
  local_250.layout_ptr.internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)grouping_idx;
  this_00 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                      (&this->gstate->grouping_states,grouping_idx);
  pDVar12 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
            ::operator*(&this_00->distinct_state);
  local_2b0 = pvVar11;
  pDVar13 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
            ::operator*(&pvVar11->distinct_data);
  local_1e8 = pDVar10->aggregates;
  ThreadContext::ThreadContext(&local_d8,((this->super_ExecutorTask).executor)->context);
  local_278.pipeline.ptr = this->pipeline;
  local_278.client = ((this->super_ExecutorTask).executor)->context;
  local_278.thread = &local_d8;
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&local_250);
  local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_250.grouping_set;
  local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc) =
           *(_Atomic_word *)
            ((long)local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc) =
           *(_Atomic_word *)
            ((long)local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc) + 1;
    }
  }
  InterruptState::InterruptState(&local_180,&local_260);
  if (local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar9 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = (local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (*(local_260.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_2a8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              ::operator*(&this_00->table_state);
  local_2b8 = &this->local_sink_state;
  if ((this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl == (LocalSinkState *)0x0)
  {
    RadixPartitionedHashTable::GetLocalSinkState(&local_250,(ExecutionContext *)local_2b0);
    pGVar6 = local_250.grouping_set;
    local_250.grouping_set = (GroupingSet *)0x0;
    _Var2._M_head_impl =
         (local_2b8->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (local_2b8->
    super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)pGVar6;
    if (_Var2._M_head_impl != (LocalSinkState *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))();
    }
    if ((LocalSinkState *)local_250.grouping_set != (LocalSinkState *)0x0) {
      (*(*(_func_int ***)&(local_250.grouping_set)->_M_t)[1])();
    }
  }
  local_198.global_state = local_2a8;
  local_198.local_state =
       unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
       operator*(local_2b8);
  local_198.interrupt_state = &local_180;
  DataChunk::DataChunk((DataChunk *)&local_250);
  pPVar3 = this->op;
  if ((pPVar3->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pPVar3->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              ((DataChunk *)&local_250,((this->super_ExecutorTask).executor)->context,
               &pPVar3->input_group_types,0x800);
  }
  local_290 = (this->op->grouped_aggregate_data).groups.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_298 = (this->op->grouped_aggregate_data).groups.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  DataChunk::DataChunk((DataChunk *)(local_158 + 0x40));
  pHVar4 = this->gstate;
  if ((pHVar4->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pHVar4->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              ((DataChunk *)(local_158 + 0x40),((this->super_ExecutorTask).executor)->context,
               &pHVar4->payload_types,0x800);
  }
  local_2c8 = pDVar13;
  local_2a0 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  uVar25 = this->aggregation_idx;
  if (uVar25 < (ulong)((long)(this->op->grouped_aggregate_data).aggregates.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->op->grouped_aggregate_data).aggregates.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_1e0 = (long)local_298 - (long)local_290;
    lVar26 = local_1e0 >> 3;
    local_2c0 = &this->aggregation_idx;
    local_250.layout_ptr.internal.
    super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_2c8->radix_tables;
    local_250.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&pDVar12->radix_states;
    local_250.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&this->radix_table_lstate;
    local_2a0 = (Event *)&local_2a0[1].total_tasks;
    local_250.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&pDVar12->distinct_output_chunks;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](local_1e8,uVar25);
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_01);
      pBVar15 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar14->super_BaseExpression);
      if (this->blocked == false) {
        this->payload_idx = this->next_payload_idx;
        this->next_payload_idx =
             ((long)(pBVar15->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar15->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) + this->next_payload_idx;
      }
      local_158._0_8_ = *local_2c0;
      if (((local_2c8->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (local_2c8->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (sVar16 = ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(&(local_2c8->info->table_map)._M_h,(key_type *)local_158), sVar16 == 0))
      {
        uVar24 = 0;
      }
      else {
        pmVar17 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&local_2c8->info->table_map,local_2c0);
        local_280 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                                  *)local_250.layout_ptr.internal.
                                    super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,*pmVar17);
        local_288 = pmVar17;
        this_02 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                                *)local_250.grouping_values.
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,*pmVar17);
        local_1d8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                    ::operator*(this_02);
        if (this->blocked == false) {
          pRVar18 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator->(local_280);
          RadixPartitionedHashTable::GetLocalSourceState
                    ((RadixPartitionedHashTable *)local_158,(ExecutionContext *)pRVar18);
          uVar7 = local_158._0_8_;
          local_158._0_8_ = (GroupingSet *)0x0;
          _Var5._M_head_impl =
               (this->radix_table_lstate).
               super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
               .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
          (this->radix_table_lstate).
          super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
          .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
               (LocalSourceState *)uVar7;
          if (_Var5._M_head_impl != (LocalSourceState *)0x0) {
            (*(_Var5._M_head_impl)->_vptr_LocalSourceState[1])();
          }
          if ((GroupingSet *)local_158._0_8_ != (GroupingSet *)0x0) {
            (*(*(_func_int ***)&((_Rep_type *)local_158._0_8_)->_M_impl)[1])();
          }
        }
        pLVar19 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                  ::operator*((unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                               *)local_250.grouping_values.
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
        this_03 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                  ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                                *)local_2a0,
                               (size_type)
                               local_250.layout_ptr.internal.
                               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
        this_04 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                  ::operator[](this_03,*local_2c0);
        local_1b0.global_state =
             unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(this_04);
        local_1b0.interrupt_state = &local_180;
        local_1b0.local_state = pLVar19;
        DataChunk::DataChunk((DataChunk *)local_158);
        context = ((this->super_ExecutorTask).executor)->context;
        this_05 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                                *)local_250.grouping_values.
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_start,*local_288);
        this_06 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->(this_05);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_1c8,this_06);
        DataChunk::Initialize
                  ((DataChunk *)local_158,context,(vector<duckdb::LogicalType,_true> *)&local_1c8,
                   0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1c8);
        do {
          DataChunk::Reset((DataChunk *)local_158);
          DataChunk::Reset((DataChunk *)&local_250);
          DataChunk::Reset((DataChunk *)(local_158 + 0x40));
          pRVar18 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator->(local_280);
          SVar8 = RadixPartitionedHashTable::GetData
                            (pRVar18,&local_278,(DataChunk *)local_158,local_1d8,&local_1b0);
          if (SVar8 == FINISHED) {
            uVar24 = 6;
          }
          else if (SVar8 == BLOCKED) {
            this->blocked = true;
            uVar24 = 1;
          }
          else {
            this_07 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                      ::operator[](&local_2c8->grouped_aggregate_data,*local_288);
            this_08 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                      ::operator*(this_07);
            if (local_298 != local_290) {
              __n = 0;
              do {
                this_09 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          ::operator[](&this_08->groups,__n);
                pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(this_09);
                pBVar20 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                    (&pEVar14->super_BaseExpression);
                pvVar21 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)&local_250,pBVar20->index);
                pvVar22 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_158,__n);
                Vector::Reference(pvVar21,pvVar22);
                __n = __n + 1;
              } while (lVar26 + (ulong)(lVar26 == 0) != __n);
            }
            local_250.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_158._24_8_;
            if ((long)(this_08->groups).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_08->groups).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != local_1e0) {
              uVar25 = 0;
              do {
                pvVar21 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)(local_158 + 0x40),
                                     this->payload_idx + uVar25);
                pvVar22 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_158,lVar26 + uVar25);
                Vector::Reference(pvVar21,pvVar22);
                uVar25 = uVar25 + 1;
              } while (uVar25 < (ulong)(((long)(this_08->groups).
                                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               .
                                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this_08->groups).
                                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               .
                                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3) -
                                       lVar26));
            }
            local_100 = (element_type *)local_158._24_8_;
            local_1d0 = *local_2c0;
            __l._M_len = 1;
            __l._M_array = &local_1d0;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1c8,__l,
                       &local_2c9);
            RadixPartitionedHashTable::Sink
                      (&local_2b0->table_data,&local_278,(DataChunk *)&local_250,&local_198,
                       (DataChunk *)(local_158 + 0x40),(unsafe_vector<idx_t> *)&local_1c8);
            if (local_1c8.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c8.
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar24 = 0;
          }
        } while (uVar24 == 0);
        if (uVar24 == 6) {
          this->blocked = false;
          uVar24 = 0;
        }
        DataChunk::~DataChunk((DataChunk *)local_158);
      }
      if ((uVar24 & 3) != 0) {
        TVar23 = TASK_BLOCKED;
        goto LAB_014efcc9;
      }
      uVar25 = this->aggregation_idx + 1;
      this->aggregation_idx = uVar25;
    } while (uVar25 < (ulong)((long)(this->op->grouped_aggregate_data).aggregates.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->op->grouped_aggregate_data).aggregates.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*(local_2b8);
  RadixPartitionedHashTable::Combine(&local_2b0->table_data,&local_278,local_2a8,lstate_p);
  TVar23 = TASK_FINISHED;
LAB_014efcc9:
  DataChunk::~DataChunk((DataChunk *)(local_158 + 0x40));
  DataChunk::~DataChunk((DataChunk *)&local_250);
  if (local_180.signal_state.internal.
      super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_180.signal_state.internal.
                 super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar9 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = (local_180.signal_state.internal.
               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_180.signal_state.internal.
       super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (*(local_180.signal_state.internal.
         super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_180.current_task.internal.
                 super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar9 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = (local_180.current_task.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (*(local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  ThreadContext::~ThreadContext(&local_d8);
  return TVar23;
}

Assistant:

TaskExecutionResult HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping(const idx_t grouping_idx) {
	D_ASSERT(op.distinct_collection_info);
	auto &info = *op.distinct_collection_info;

	auto &grouping_data = op.groupings[grouping_idx];
	auto &grouping_state = gstate.grouping_states[grouping_idx];
	D_ASSERT(grouping_state.distinct_state);
	auto &distinct_state = *grouping_state.distinct_state;
	auto &distinct_data = *grouping_data.distinct_data;

	auto &aggregates = info.aggregates;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, &pipeline);

	// Sink state to sink into global HTs
	InterruptState interrupt_state(shared_from_this());
	auto &global_sink_state = *grouping_state.table_state;
	if (!local_sink_state) {
		local_sink_state = grouping_data.table_data.GetLocalSinkState(execution_context);
	}
	OperatorSinkInput sink_input {global_sink_state, *local_sink_state, interrupt_state};

	// Create a chunk that mimics the 'input' chunk in Sink, for storing the group vectors
	DataChunk group_chunk;
	if (!op.input_group_types.empty()) {
		group_chunk.Initialize(executor.context, op.input_group_types);
	}

	const idx_t group_by_size = op.grouped_aggregate_data.groups.size();

	DataChunk aggregate_input_chunk;
	if (!gstate.payload_types.empty()) {
		aggregate_input_chunk.Initialize(executor.context, gstate.payload_types);
	}

	const auto &finalize_event = event->Cast<HashAggregateDistinctFinalizeEvent>();

	auto &agg_idx = aggregation_idx;
	for (; agg_idx < op.grouped_aggregate_data.aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		if (!blocked) {
			// Forward the payload idx
			payload_idx = next_payload_idx;
			next_payload_idx = payload_idx + aggregate.children.size();
		}

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		D_ASSERT(distinct_data.info.table_map.count(agg_idx));
		const auto &table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = distinct_data.radix_tables[table_idx];

		auto &sink = *distinct_state.radix_states[table_idx];
		if (!blocked) {
			radix_table_lstate = radix_table->GetLocalSourceState(execution_context);
		}
		auto &local_source = *radix_table_lstate;
		OperatorSourceInput source_input {*finalize_event.global_source_states[grouping_idx][agg_idx], local_source,
		                                  interrupt_state};

		// Create a duplicate of the output_chunk, because of multi-threading we cant alter the original
		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		// Fetch all the data from the aggregate ht, and Sink it into the main ht
		while (true) {
			output_chunk.Reset();
			group_chunk.Reset();
			aggregate_input_chunk.Reset();

			auto res = radix_table->GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			auto &grouped_aggregate_data = *distinct_data.grouped_aggregate_data[table_idx];
			for (idx_t group_idx = 0; group_idx < group_by_size; group_idx++) {
				auto &group = grouped_aggregate_data.groups[group_idx];
				auto &bound_ref_expr = group->Cast<BoundReferenceExpression>();
				group_chunk.data[bound_ref_expr.index].Reference(output_chunk.data[group_idx]);
			}
			group_chunk.SetCardinality(output_chunk);

			for (idx_t child_idx = 0; child_idx < grouped_aggregate_data.groups.size() - group_by_size; child_idx++) {
				aggregate_input_chunk.data[payload_idx + child_idx].Reference(
				    output_chunk.data[group_by_size + child_idx]);
			}
			aggregate_input_chunk.SetCardinality(output_chunk);

			// Sink it into the main ht
			grouping_data.table_data.Sink(execution_context, group_chunk, sink_input, aggregate_input_chunk, {agg_idx});
		}
		blocked = false;
	}
	grouping_data.table_data.Combine(execution_context, global_sink_state, *local_sink_state);
	return TaskExecutionResult::TASK_FINISHED;
}